

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

void __thiscall
duckdb::BindContext::AddTableFunction
          (BindContext *this,idx_t index,string *alias,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,
          vector<duckdb::ColumnIndex,_true> *bound_column_ids,
          optional_ptr<duckdb::StandardEntry,_true> entry,virtual_column_map_t virtual_columns)

{
  _Head_base<0UL,_duckdb::Binding_*,_false> local_30;
  Binding *local_28;
  idx_t index_local;
  optional_ptr<duckdb::StandardEntry,_true> entry_local;
  
  entry_local = entry;
  index_local = index;
  make_uniq<duckdb::TableBinding,std::__cxx11::string_const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::ColumnIndex,true>&,duckdb::optional_ptr<duckdb::StandardEntry,true>&,unsigned_long&,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
            ((duckdb *)&local_28,alias,types,names,bound_column_ids,&entry_local,&index_local,
             (unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
              *)virtual_columns._M_h._M_buckets);
  local_30._M_head_impl = local_28;
  local_28 = (Binding *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
              *)&this->bindings_list,
             (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)&local_30);
  if (local_30._M_head_impl != (Binding *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Binding[1])();
  }
  local_30._M_head_impl = (Binding *)0x0;
  if (local_28 != (Binding *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return;
}

Assistant:

void BindContext::AddTableFunction(idx_t index, const string &alias, const vector<string> &names,
                                   const vector<LogicalType> &types, vector<ColumnIndex> &bound_column_ids,
                                   optional_ptr<StandardEntry> entry, virtual_column_map_t virtual_columns) {
	AddBinding(
	    make_uniq<TableBinding>(alias, types, names, bound_column_ids, entry, index, std::move(virtual_columns)));
}